

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict par_type_name(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  node_t_conflict pnVar3;
  char *expected_name;
  int token_code;
  
  ppVar1 = c2m_ctx->parse_ctx;
  token_code = 0x28;
  iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    if (ppVar1->record_level != 0) goto LAB_00165187;
  }
  else {
    pnVar3 = type_name(c2m_ctx,no_err_p);
    if (pnVar3 == &err_struct) {
      return &err_struct;
    }
    token_code = 0x29;
    iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 != 0) {
      return pnVar3;
    }
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
  }
  expected_name = get_token_name(c2m_ctx,token_code);
  syntax_error(c2m_ctx,expected_name);
LAB_00165187:
  return &err_struct;
}

Assistant:

D (par_type_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;

  PT ('(');
  P (type_name);
  PT (')');
  return r;
}